

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

void __thiscall spv::Builder::dump(Builder *this,Vector<unsigned_int> *out)

{
  _Rb_tree_header *p_Var1;
  iterator iVar2;
  Builder *pBVar3;
  pointer ppcVar4;
  Builder *this_00;
  Builder *pBVar5;
  long lVar6;
  Instruction memInst;
  Instruction sourceExtInst;
  undefined1 local_a8 [24];
  undefined1 local_90 [32];
  Builder *local_70;
  undefined1 local_68 [16];
  Op local_58;
  undefined1 local_50 [16];
  pointer local_40;
  _Alloc_hider _Stack_38;
  
  pBVar5 = (Builder *)local_a8;
  iVar2._M_current =
       (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl
      .super__Vector_impl_data._M_end_of_storage) {
    this_00 = (Builder *)out;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)out,iVar2,
               &MagicNumber);
  }
  else {
    *iVar2._M_current = 0x7230203;
    (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    this_00 = this;
  }
  iVar2._M_current =
       (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl
      .super__Vector_impl_data._M_end_of_storage) {
    this_00 = (Builder *)out;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)out,iVar2,
               &Version);
  }
  else {
    *iVar2._M_current = 0x10600;
    (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_a8._0_4_ = this->builderNumber;
  iVar2._M_current =
       (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl
      .super__Vector_impl_data._M_end_of_storage) {
    this_00 = (Builder *)out;
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
    _M_realloc_insert<unsigned_int>(out,iVar2,(uint *)local_a8);
  }
  else {
    *iVar2._M_current = local_a8._0_4_;
    (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_a8._0_4_ = this->uniqueId + 1;
  iVar2._M_current =
       (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl
      .super__Vector_impl_data._M_end_of_storage) {
    this_00 = (Builder *)out;
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
    _M_realloc_insert<unsigned_int>(out,iVar2,(uint *)local_a8);
  }
  else {
    *iVar2._M_current = local_a8._0_4_;
    (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_a8._0_8_ = (ulong)(uint)local_a8._4_4_ << 0x20;
  iVar2._M_current =
       (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl
      .super__Vector_impl_data._M_end_of_storage) {
    this_00 = (Builder *)out;
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
    _M_realloc_insert<unsigned_int>(out,iVar2,(uint *)local_a8);
  }
  else {
    *iVar2._M_current = 0;
    (out->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  pBVar3 = (Builder *)(this->capabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->capabilities)._M_t._M_impl.super__Rb_tree_header;
  if (pBVar3 != (Builder *)p_Var1) {
    do {
      this_00 = pBVar3;
      local_a8._0_8_ = &PTR__Instruction_001f81e0;
      local_a8._8_4_ = SourceLanguageUnknown;
      local_a8._12_4_ = 0;
      local_a8._16_4_ = OpCapability;
      local_90._16_8_ = (pointer)0x0;
      local_90._24_8_ = (Block *)0x0;
      local_90._0_8_ = (pointer)0x0;
      local_90._8_8_ = (pointer)0x0;
      local_68._0_4_ = (int)(this_00->sourceText)._M_string_length;
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)local_90,
                 (iterator)0x0,(uint *)local_68);
      Instruction::dump((Instruction *)local_a8,out);
      local_a8._0_8_ = &PTR__Instruction_001f81e0;
      std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                 local_90);
      pBVar3 = (Builder *)std::_Rb_tree_increment((_Rb_tree_node_base *)this_00);
    } while (pBVar3 != (Builder *)p_Var1);
  }
  pBVar3 = (Builder *)(this->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->extensions)._M_t._M_impl.super__Rb_tree_header;
  local_70 = this;
  if (pBVar3 != (Builder *)p_Var1) {
    do {
      this_00 = pBVar3;
      local_a8._0_8_ = &PTR__Instruction_001f81e0;
      local_a8._8_4_ = SourceLanguageUnknown;
      local_a8._12_4_ = 0;
      local_a8._16_4_ = OpExtension;
      local_90._16_8_ = (pointer)0x0;
      local_90._24_8_ = (Block *)0x0;
      local_90._0_8_ = (pointer)0x0;
      local_90._8_8_ = (pointer)0x0;
      Instruction::addStringOperand
                ((Instruction *)local_a8,(char *)(this_00->sourceText)._M_string_length);
      Instruction::dump((Instruction *)local_a8,out);
      local_a8._0_8_ = &PTR__Instruction_001f81e0;
      std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                 local_90);
      pBVar3 = (Builder *)std::_Rb_tree_increment((_Rb_tree_node_base *)this_00);
    } while (pBVar3 != (Builder *)p_Var1);
  }
  pBVar3 = local_70;
  dumpInstructions(this_00,out,&local_70->imports);
  local_a8._0_8_ = &PTR__Instruction_001f81e0;
  local_a8._8_4_ = SourceLanguageUnknown;
  local_a8._12_4_ = 0;
  local_a8._16_4_ = OpMemoryModel;
  local_90._0_8_ = (pointer)0x0;
  local_90._8_8_ = (uint *)0x0;
  local_90._16_8_ = (uint *)0x0;
  local_90._24_8_ = (Block *)0x0;
  local_68._0_4_ = pBVar3->addressModel;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)local_90,
             (iterator)0x0,(uint *)local_68);
  local_68._0_4_ = pBVar3->memoryModel;
  if (local_90._8_8_ == local_90._16_8_) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)local_90,
               (iterator)local_90._8_8_,(uint *)local_68);
  }
  else {
    *(MemoryModel *)local_90._8_8_ = pBVar3->memoryModel;
    local_90._8_8_ = local_90._8_8_ + 4;
  }
  Instruction::dump((Instruction *)local_a8,out);
  dumpInstructions(pBVar5,out,&pBVar3->entryPoints);
  dumpInstructions(pBVar5,out,&pBVar3->executionModes);
  dumpInstructions(pBVar5,out,&pBVar3->strings);
  dumpModuleProcesses(pBVar3,out);
  pBVar5 = pBVar3;
  dumpSourceInstructions(pBVar3,out);
  ppcVar4 = (pBVar3->sourceExtensions).
            super__Vector_base<const_char_*,_dxil_spv::ThreadLocalAllocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pBVar3->sourceExtensions).
                              super__Vector_base<const_char_*,_dxil_spv::ThreadLocalAllocator<const_char_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar4) >> 3)) {
    lVar6 = 0;
    do {
      local_68._0_8_ = &PTR__Instruction_001f81e0;
      local_68._8_8_ = 0;
      local_58 = OpSourceExtension;
      local_40 = (pointer)0x0;
      _Stack_38._M_p = (pointer)0x0;
      local_50._0_8_ = (_Base_ptr)0x0;
      local_50._8_8_ = (_Base_ptr)0x0;
      Instruction::addStringOperand((Instruction *)local_68,ppcVar4[lVar6]);
      Instruction::dump((Instruction *)local_68,out);
      local_68._0_8_ = &PTR__Instruction_001f81e0;
      pBVar5 = (Builder *)local_50;
      std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                 local_50);
      lVar6 = lVar6 + 1;
      ppcVar4 = (pBVar3->sourceExtensions).
                super__Vector_base<const_char_*,_dxil_spv::ThreadLocalAllocator<const_char_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (lVar6 < (int)((ulong)((long)(pBVar3->sourceExtensions).
                                         super__Vector_base<const_char_*,_dxil_spv::ThreadLocalAllocator<const_char_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar4)
                          >> 3));
  }
  dumpInstructions(pBVar5,out,&pBVar3->names);
  dumpInstructions(pBVar5,out,&pBVar3->lines);
  dumpInstructions(pBVar5,out,&pBVar3->decorations);
  dumpInstructions(pBVar5,out,&pBVar3->constantsTypesGlobals);
  dumpInstructions(pBVar5,out,&pBVar3->externals);
  Module::dump(&pBVar3->module,out);
  local_a8._0_8_ = &PTR__Instruction_001f81e0;
  std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_90);
  return;
}

Assistant:

void Builder::dump(dxil_spv::Vector<unsigned int>& out) const
{
    // Header, before first instructions:
    out.push_back(MagicNumber);
    out.push_back(Version);
    out.push_back(builderNumber);
    out.push_back(uniqueId + 1);
    out.push_back(0);

    // Capabilities
    for (auto it = capabilities.cbegin(); it != capabilities.cend(); ++it) {
        Instruction capInst(0, 0, OpCapability);
        capInst.addImmediateOperand(*it);
        capInst.dump(out);
    }

    for (auto it = extensions.cbegin(); it != extensions.cend(); ++it) {
        Instruction extInst(0, 0, OpExtension);
        extInst.addStringOperand(it->c_str());
        extInst.dump(out);
    }

    dumpInstructions(out, imports);
    Instruction memInst(0, 0, OpMemoryModel);
    memInst.addImmediateOperand(addressModel);
    memInst.addImmediateOperand(memoryModel);
    memInst.dump(out);

    // Instructions saved up while building:
    dumpInstructions(out, entryPoints);
    dumpInstructions(out, executionModes);

    // Debug instructions
    dumpInstructions(out, strings);
    dumpModuleProcesses(out);
    dumpSourceInstructions(out);
    for (int e = 0; e < (int)sourceExtensions.size(); ++e) {
        Instruction sourceExtInst(0, 0, OpSourceExtension);
        sourceExtInst.addStringOperand(sourceExtensions[e]);
        sourceExtInst.dump(out);
    }
    dumpInstructions(out, names);
    dumpInstructions(out, lines);

    // Annotation instructions
    dumpInstructions(out, decorations);

    dumpInstructions(out, constantsTypesGlobals);
    dumpInstructions(out, externals);

    // The functions
    module.dump(out);
}